

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O2

CommaInitializer<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::operator_
          (CommaInitializer<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *this,Scalar *s)

{
  Index *pIVar1;
  Scalar SVar2;
  long lVar3;
  uint __line;
  long lVar4;
  char *__assertion;
  
  lVar4 = this->m_col;
  if (lVar4 == 3) {
    lVar3 = this->m_currentBlockRows;
    this->m_col = 0;
    pIVar1 = &this->m_row;
    lVar4 = *pIVar1;
    *pIVar1 = *pIVar1 + lVar3;
    this->m_currentBlockRows = 1;
    if (*pIVar1 == 0 || SCARRY8(lVar4,lVar3) != *pIVar1 < 0) {
      lVar4 = 0;
LAB_00226dbb:
      SVar2 = *s;
      this->m_col = lVar4 + 1;
      this->m_xpr[this->m_row].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[lVar4] = SVar2;
      return this;
    }
    __assertion = "m_row<m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
    ;
    __line = 0x45;
  }
  else if (lVar4 < 3) {
    if (this->m_currentBlockRows == 1) goto LAB_00226dbb;
    __assertion = "m_currentBlockRows==1";
    __line = 0x49;
  }
  else {
    __assertion = 
    "m_col<m_xpr.cols() && \"Too many coefficients passed to comma initializer (operator<<)\"";
    __line = 0x48;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/CommaInitializer.h"
                ,__line,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 1, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, 1, 3>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const Scalar& s)
  {
    if (m_col==m_xpr.cols())
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = 1;
      eigen_assert(m_row<m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert(m_col<m_xpr.cols()
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==1);
    m_xpr.coeffRef(m_row, m_col++) = s;
    return *this;
  }